

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O2

int Abc_NodeCompareLevels(Abc_Obj_t **pp1,Abc_Obj_t **pp2)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = *(uint *)&(*pp1)->field_0x14 >> 0xc;
  uVar3 = *(uint *)&(*pp2)->field_0x14 >> 0xc;
  if (uVar3 <= uVar4) {
    if (uVar4 != uVar3) {
      return 1;
    }
    iVar1 = (*pp2)->Id;
    iVar2 = (*pp1)->Id;
    if (iVar1 <= iVar2) {
      return (int)(iVar2 != iVar1);
    }
  }
  return -1;
}

Assistant:

int Abc_NodeCompareLevels( Abc_Obj_t ** pp1, Abc_Obj_t ** pp2 )
{
    int Diff = Abc_ObjLevel(*pp1) - Abc_ObjLevel(*pp2);
    if ( Diff < 0 )
        return -1;
    if ( Diff > 0 ) 
        return 1;
    Diff = (*pp1)->Id - (*pp2)->Id; // needed to make qsort() platform-infependent
    if ( Diff < 0 )
        return -1;
    if ( Diff > 0 ) 
        return 1;
    return 0; 
}